

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::RegisterSecretInternal
          (SecretManager *this,CatalogTransaction transaction,
          unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
          *secret,OnCreateConflict on_conflict,SecretPersistType persist_type,string *storage)

{
  _Head_base<0UL,_const_duckdb::BaseSecret_*,_false> _Var1;
  int iVar2;
  pointer pBVar3;
  InvalidInputException *pIVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true> *this_00
  ;
  char *in_R9;
  char cVar5;
  string resolved_storage;
  optional_ptr<duckdb::SecretStorage,_true> local_110;
  string local_108;
  _Head_base<0UL,_const_duckdb::BaseSecret_*,_false> local_e8;
  undefined4 local_dc;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  SecretType local_98;
  
  this_00 = (unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
             *)CONCAT71(in_register_00000011,on_conflict);
  cVar5 = (char)storage;
  local_dc = (undefined4)CONCAT71(in_register_00000009,persist_type);
  pBVar3 = unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>,_true>
           ::operator->(this_00);
  LookupTypeInternal(&local_98,(SecretManager *)secret,&pBVar3->type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.extension._M_dataplus._M_p != &local_98.extension.field_2) {
    operator_delete(local_98.extension._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.default_provider._M_dataplus._M_p != &local_98.default_provider.field_2) {
    operator_delete(local_98.default_provider._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != &local_98.name.field_2) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if (cVar5 == '\0') {
    if (*(long *)(in_R9 + 8) == 0) {
      cVar5 = *(char *)&secret[0x1c].
                        super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                        ._M_t.
                        super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                        .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
    }
    else {
      iVar2 = ::std::__cxx11::string::compare(in_R9);
      cVar5 = '\x02' - (iVar2 == 0);
    }
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  if (*(long *)(in_R9 + 8) == 0) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    if (cVar5 == '\x02') {
      _Var1._M_head_impl =
           secret[0x25].
           super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
           ._M_t.
           super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
           .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,_Var1._M_head_impl,
                 (long)&(secret[0x26].
                         super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                         ._M_t.
                         super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                         .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl)->
                        _vptr_BaseSecret + (long)_Var1._M_head_impl);
    }
    else {
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"memory","");
    }
    ::std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)&local_d8);
  }
  local_110 = GetSecretStorage((SecretManager *)secret,&local_d8);
  if (local_110.ptr == (SecretStorage *)0x0) {
    if ((*(char *)&secret[0x29].
                   super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                   ._M_t.
                   super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                   .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl == '\0')
       && ((cVar5 == '\x02' || (iVar2 = ::std::__cxx11::string::compare(in_R9), iVar2 == 0)))) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,
                 "Persistent secrets are disabled. Restart DuckDB and enable persistent secrets through \'SET allow_persistent_secrets=true\'"
                 ,"");
      InvalidInputException::InvalidInputException(pIVar4,&local_108);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"Secret storage \'%s\' not found!","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar4,&local_108,&local_b8);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (cVar5 == '\x02') {
    optional_ptr<duckdb::SecretStorage,_true>::CheckValid(&local_110);
    if ((local_110.ptr)->persistent != true) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,
                 "Cannot create persistent secrets in a temporary secret storage!","");
      InvalidInputException::InvalidInputException(pIVar4,&local_108);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(char *)&secret[0x29].
                  super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                  ._M_t.
                  super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
                  .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl == '\0') {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,
                 "Persistent secrets are currently disabled. To enable them, restart duckdb and run \'SET allow_persistent_secrets=true\'"
                 ,"");
      InvalidInputException::InvalidInputException(pIVar4,&local_108);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    optional_ptr<duckdb::SecretStorage,_true>::CheckValid(&local_110);
    if ((local_110.ptr)->persistent == true) {
      pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,
                 "Cannot create temporary secrets in a persistent secret storage!","");
      InvalidInputException::InvalidInputException(pIVar4,&local_108);
      __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  optional_ptr<duckdb::SecretStorage,_true>::CheckValid(&local_110);
  local_e8._M_head_impl =
       (this_00->
       super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>).
       _M_t.
       super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
       .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl;
  (this_00->
  super_unique_ptr<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>)._M_t.
  super___uniq_ptr_impl<const_duckdb::BaseSecret,_std::default_delete<const_duckdb::BaseSecret>_>.
  _M_t.
  super__Tuple_impl<0UL,_const_duckdb::BaseSecret_*,_std::default_delete<const_duckdb::BaseSecret>_>
  .super__Head_base<0UL,_const_duckdb::BaseSecret_*,_false>._M_head_impl = (BaseSecret *)0x0;
  (*(local_110.ptr)->_vptr_SecretStorage[3])
            (this,local_110.ptr,&local_e8,(ulong)(byte)local_dc,&transaction);
  if (local_e8._M_head_impl != (BaseSecret *)0x0) {
    (*(local_e8._M_head_impl)->_vptr_BaseSecret[1])();
  }
  local_e8._M_head_impl = (BaseSecret *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)this;
}

Assistant:

unique_ptr<SecretEntry> SecretManager::RegisterSecretInternal(CatalogTransaction transaction,
                                                              unique_ptr<const BaseSecret> secret,
                                                              OnCreateConflict on_conflict,
                                                              SecretPersistType persist_type, const string &storage) {
	//! Ensure we only create secrets for known types;
	LookupTypeInternal(secret->GetType());

	//! Handle default for persist type
	if (persist_type == SecretPersistType::DEFAULT) {
		if (storage.empty()) {
			persist_type = config.default_persist_type;
		} else if (storage == TEMPORARY_STORAGE_NAME) {
			persist_type = SecretPersistType::TEMPORARY;
		} else {
			persist_type = SecretPersistType::PERSISTENT;
		}
	}

	//! Resolve storage
	string resolved_storage;
	if (storage.empty()) {
		resolved_storage =
		    persist_type == SecretPersistType::PERSISTENT ? config.default_persistent_storage : TEMPORARY_STORAGE_NAME;
	} else {
		resolved_storage = storage;
	}

	//! Lookup which backend to store the secret in
	auto backend = GetSecretStorage(resolved_storage);
	if (!backend) {
		if (!config.allow_persistent_secrets &&
		    (persist_type == SecretPersistType::PERSISTENT || storage == LOCAL_FILE_STORAGE_NAME)) {
			throw InvalidInputException("Persistent secrets are disabled. Restart DuckDB and enable persistent secrets "
			                            "through 'SET allow_persistent_secrets=true'");
		}
		throw InvalidInputException("Secret storage '%s' not found!", resolved_storage);
	}

	// Validation on both allow_persistent_secrets and storage backend's own persist type
	if (persist_type == SecretPersistType::PERSISTENT) {
		if (backend->persistent) {
			if (!config.allow_persistent_secrets) {
				throw InvalidInputException(
				    "Persistent secrets are currently disabled. To enable them, restart duckdb and "
				    "run 'SET allow_persistent_secrets=true'");
			}
		} else { // backend is temp
			throw InvalidInputException("Cannot create persistent secrets in a temporary secret storage!");
		}
	} else { // SecretPersistType::TEMPORARY
		if (backend->persistent) {
			throw InvalidInputException("Cannot create temporary secrets in a persistent secret storage!");
		}
	}
	return backend->StoreSecret(std::move(secret), on_conflict, &transaction);
}